

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType *
add_type_coercion(Context_conflict *ctx,MOJOSHADER_astExpression **left,
                 MOJOSHADER_astDataType *_ldatatype,MOJOSHADER_astExpression **right,
                 MOJOSHADER_astDataType *_rdatatype)

{
  bool bVar1;
  bool bVar2;
  MOJOSHADER_astExpression *pMVar3;
  bool bVar4;
  bool bVar5;
  int local_cc;
  int local_c8;
  anon_enum_32 choice;
  MOJOSHADER_astDataTypeType type_1;
  int r;
  int rmatrix;
  int rvector;
  MOJOSHADER_astDataTypeType type;
  int l;
  int lmatrix;
  int lvector;
  anon_struct_16_4_0ca24d28 typeinf [6];
  MOJOSHADER_astDataType *rdatatype;
  MOJOSHADER_astDataType *ldatatype;
  MOJOSHADER_astDataType *_rdatatype_local;
  MOJOSHADER_astExpression **right_local;
  MOJOSHADER_astDataType *_ldatatype_local;
  MOJOSHADER_astExpression **left_local;
  Context_conflict *ctx_local;
  
  ctx_local = (Context_conflict *)reduce_datatype(ctx,_ldatatype);
  typeinf[5]._8_8_ = reduce_datatype(ctx,_rdatatype);
  if (ctx_local != (Context_conflict *)typeinf[5]._8_8_) {
    memcpy(&lmatrix,&DAT_001672a0,0x60);
    bVar1 = false;
    bVar4 = false;
    rvector = 6;
    if ((MOJOSHADER_astDataType *)ctx_local != (MOJOSHADER_astDataType *)0x0) {
      rmatrix = *(int *)ctx_local;
      if (rmatrix == MOJOSHADER_AST_DATATYPE_VECTOR) {
        bVar1 = true;
        rmatrix = ((MOJOSHADER_astDataTypeArray *)ctx_local)->base->type;
      }
      else {
        bVar4 = rmatrix == MOJOSHADER_AST_DATATYPE_MATRIX;
        if (bVar4) {
          rmatrix = ((MOJOSHADER_astDataTypeArray *)ctx_local)->base->type;
        }
      }
      rvector = 0;
      while (((uint)rvector < 6 && ((&lmatrix)[(long)rvector * 4] != rmatrix))) {
        rvector = rvector + 1;
      }
    }
    bVar2 = false;
    bVar5 = false;
    choice = 6;
    if (typeinf[5]._8_8_ != 0) {
      local_c8 = *(int *)typeinf[5]._8_8_;
      if (local_c8 == 0x12) {
        bVar2 = true;
        local_c8 = **(int **)(typeinf[5]._8_8_ + 8);
      }
      else {
        bVar5 = local_c8 == 0x13;
        if (bVar5) {
          local_c8 = **(int **)(typeinf[5]._8_8_ + 8);
        }
      }
      choice = CHOOSE_NEITHER;
      while ((choice < 6 && ((&lmatrix)[(long)(int)choice * 4] != local_c8))) {
        choice = choice + CHOOSE_LEFT;
      }
    }
    local_cc = 0;
    if (((uint)rvector < 6) && (choice < 6)) {
      if (left == (MOJOSHADER_astExpression **)0x0) {
        local_cc = 1;
      }
      else if ((!bVar4) || (bVar5)) {
        if ((bVar4) || (!bVar5)) {
          if ((!bVar1) || (bVar2)) {
            if ((bVar1) || (!bVar2)) {
              if (typeinf[(long)(int)choice + -1].floating < typeinf[(long)rvector + -1].floating) {
                local_cc = 1;
              }
              else if (typeinf[(long)rvector + -1].floating <
                       typeinf[(long)(int)choice + -1].floating) {
                local_cc = 2;
              }
              else if ((typeinf[rvector].bits == 0) || (typeinf[(int)choice].bits != 0)) {
                if ((typeinf[rvector].bits == 0) && (typeinf[(int)choice].bits != 0)) {
                  local_cc = 2;
                }
                else if ((typeinf[rvector].type == MOJOSHADER_AST_DATATYPE_NONE) ||
                        (typeinf[(int)choice].type != MOJOSHADER_AST_DATATYPE_NONE)) {
                  if ((typeinf[rvector].type == MOJOSHADER_AST_DATATYPE_NONE) &&
                     (typeinf[(int)choice].type != MOJOSHADER_AST_DATATYPE_NONE)) {
                    local_cc = 2;
                  }
                }
                else {
                  local_cc = 1;
                }
              }
              else {
                local_cc = 1;
              }
            }
            else {
              local_cc = 2;
            }
          }
          else {
            local_cc = 1;
          }
        }
        else {
          local_cc = 2;
        }
      }
      else {
        local_cc = 1;
      }
    }
    if (local_cc == 1) {
      pMVar3 = new_cast_expr(ctx,_ldatatype,*right);
      *right = pMVar3;
      ctx_local = (Context_conflict *)_ldatatype;
    }
    else if (local_cc == 2) {
      pMVar3 = new_cast_expr(ctx,_rdatatype,*left);
      *left = pMVar3;
      ctx_local = (Context_conflict *)_rdatatype;
    }
    else {
      if (local_cc != 0) {
        __assert_fail("choice == CHOOSE_NEITHER",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                      ,0x8b6,
                      "const MOJOSHADER_astDataType *add_type_coercion(Context *, MOJOSHADER_astExpression **, const MOJOSHADER_astDataType *, MOJOSHADER_astExpression **, const MOJOSHADER_astDataType *)"
                     );
      }
      fail(ctx,"incompatible data types");
      delete_expr(ctx,*right);
      pMVar3 = new_literal_int_expr(ctx,0);
      pMVar3 = new_cast_expr(ctx,_ldatatype,pMVar3);
      *right = pMVar3;
    }
  }
  return (MOJOSHADER_astDataType *)ctx_local;
}

Assistant:

static const MOJOSHADER_astDataType *add_type_coercion(Context *ctx,
                                     MOJOSHADER_astExpression **left,
                                     const MOJOSHADER_astDataType *_ldatatype,
                                     MOJOSHADER_astExpression **right,
                                     const MOJOSHADER_astDataType *_rdatatype)
{
    // !!! FIXME: this whole function is probably naive at best.
    const MOJOSHADER_astDataType *ldatatype = reduce_datatype(ctx, _ldatatype);
    const MOJOSHADER_astDataType *rdatatype = reduce_datatype(ctx, _rdatatype);

    if (ldatatype == rdatatype)
        return ldatatype;   // they already match, so we're done.

    struct {
        const MOJOSHADER_astDataTypeType type;
        const int bits;
        const int is_unsigned;
        const int floating;
    } typeinf[] = {
        { MOJOSHADER_AST_DATATYPE_BOOL,    1, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_HALF,   16, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_INT,    32, 0, 0 },
        { MOJOSHADER_AST_DATATYPE_UINT,   32, 1, 0 },
        { MOJOSHADER_AST_DATATYPE_FLOAT,  32, 0, 1 },
        { MOJOSHADER_AST_DATATYPE_DOUBLE, 64, 0, 1 },
    };

    int lvector = 0;
    int lmatrix = 0;
    int l = STATICARRAYLEN(typeinf);
    if (ldatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = ldatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            lvector = 1;
            type = ldatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            lmatrix = 1;
            type = ldatatype->matrix.base->type;
        } // if

        for (l = 0; l < STATICARRAYLEN(typeinf); l++)
        {
            if (typeinf[l].type == type)
                break;
        } // for
    } // if

    int rvector = 0;
    int rmatrix = 0;
    int r = STATICARRAYLEN(typeinf);
    if (rdatatype != NULL)
    {
        MOJOSHADER_astDataTypeType type = rdatatype->type;
        if (type == MOJOSHADER_AST_DATATYPE_VECTOR)
        {
            rvector = 1;
            type = rdatatype->vector.base->type;
        } // if
        else if (type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            rmatrix = 1;
            type = rdatatype->matrix.base->type;
        } // if

        for (r = 0; r < STATICARRAYLEN(typeinf); r++)
        {
            if (typeinf[r].type == type)
                break;
        } // for
    } // if

    enum { CHOOSE_NEITHER, CHOOSE_LEFT, CHOOSE_RIGHT } choice = CHOOSE_NEITHER;
    if ((l < STATICARRAYLEN(typeinf)) && (r < STATICARRAYLEN(typeinf)))
    {
        if (left == NULL)
            choice = CHOOSE_LEFT;  // we need to force to the lvalue.
        else if (lmatrix && !rmatrix)
            choice = CHOOSE_LEFT;
        else if (!lmatrix && rmatrix)
            choice = CHOOSE_RIGHT;
        else if (lvector && !rvector)
            choice = CHOOSE_LEFT;
        else if (!lvector && rvector)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].bits > typeinf[r].bits)
            choice = CHOOSE_LEFT;
        else if (typeinf[l].bits < typeinf[r].bits)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].floating && !typeinf[r].floating)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].floating && typeinf[r].floating)
            choice = CHOOSE_RIGHT;
        else if (typeinf[l].is_unsigned && !typeinf[r].is_unsigned)
            choice = CHOOSE_LEFT;
        else if (!typeinf[l].is_unsigned && typeinf[r].is_unsigned)
            choice = CHOOSE_RIGHT;
    } // if

    if (choice == CHOOSE_LEFT)
    {
        *right = new_cast_expr(ctx, _ldatatype, *right);
        return _ldatatype;
    } // if
    else if (choice == CHOOSE_RIGHT)
    {
        *left = new_cast_expr(ctx, _rdatatype, *left);
        return _rdatatype;
    } // else if

    assert(choice == CHOOSE_NEITHER);
    fail(ctx, "incompatible data types");
    // Ditch original (*right), force a literal value that matches
    //  ldatatype, so further processing is normalized.
    // !!! FIXME: force (right) to match (left).
    delete_expr(ctx, *right);
    *right = new_cast_expr(ctx, _ldatatype, new_literal_int_expr(ctx, 0));
    return ldatatype;
}